

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  size_t __n;
  byte bVar4;
  size_t byte_len;
  size_t unused_bits;
  size_t len;
  size_t bits_local;
  uchar *buf_local;
  uchar *start_local;
  uchar **p_local;
  
  uVar3 = bits + 7 >> 3;
  bVar4 = (char)uVar3 * '\b' - (char)bits;
  if ((*p < start) || ((ulong)((long)*p - (long)start) < uVar3 + 1)) {
    p_local._4_4_ = -0x6c;
  }
  else {
    if (uVar3 != 0) {
      __n = uVar3 - 1;
      bVar1 = buf[__n];
      puVar2 = *p;
      *p = puVar2 + -1;
      puVar2[-1] = bVar1 & ((char)(1 << (bVar4 & 0x1f)) - 1U ^ 0xff);
      *p = *p + -__n;
      memcpy(*p,buf,__n);
    }
    puVar2 = *p;
    *p = puVar2 + -1;
    puVar2[-1] = bVar4;
    p_local._4_4_ = mbedtls_asn1_write_len_and_tag(p,start,uVar3 + 1,'\x03');
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_bitstring(unsigned char **p, const unsigned char *start,
                                 const unsigned char *buf, size_t bits)
{
    size_t len = 0;
    size_t unused_bits, byte_len;

    byte_len = (bits + 7) / 8;
    unused_bits = (byte_len * 8) - bits;

    if (*p < start || (size_t) (*p - start) < byte_len + 1) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    len = byte_len + 1;

    /* Write the bitstring. Ensure the unused bits are zeroed */
    if (byte_len > 0) {
        byte_len--;
        *--(*p) = buf[byte_len] & ~((0x1 << unused_bits) - 1);
        (*p) -= byte_len;
        memcpy(*p, buf, byte_len);
    }

    /* Write unused bits */
    *--(*p) = (unsigned char) unused_bits;

    return mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_BIT_STRING);
}